

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O2

bool __thiscall
rapidjson::
GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>::
operator==(GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           *this,GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 *rhs)

{
  ushort uVar1;
  bool bVar2;
  ConstMemberIterator name;
  ConstMemberIterator CVar3;
  ConstMemberIterator CVar4;
  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
  *this_00;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *rhs_00;
  ushort uVar5;
  SizeType i;
  uint index;
  bool bVar6;
  double dVar7;
  double dVar8;
  
  uVar5 = *(ushort *)(this + 0xe) & 7;
  uVar1 = (rhs->data_).f.flags;
  if (uVar5 == (uVar1 & 7)) {
    switch(uVar5) {
    case 3:
      if (*(SizeType *)this == (rhs->data_).s.length) {
        name = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::MemberBegin((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                              *)this);
        while( true ) {
          CVar3 = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::MemberEnd((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                               *)this);
          bVar6 = name.ptr_ == CVar3.ptr_;
          if (bVar6) {
            return bVar6;
          }
          CVar3 = FindMember<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                            ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                              *)rhs,&(name.ptr_)->name);
          CVar4 = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::MemberEnd(rhs);
          if (CVar3.ptr_ == CVar4.ptr_) break;
          bVar2 = operator==((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                              *)&(name.ptr_)->value,&(CVar3.ptr_)->value);
          name.ptr_ = name.ptr_ + 1;
          if (!bVar2) {
            return bVar6;
          }
        }
        return bVar6;
      }
      goto LAB_001431b7;
    case 4:
      index = 0;
      bVar6 = false;
      if (*(SizeType *)this == (rhs->data_).s.length) {
        do {
          bVar6 = *(uint *)this <= index;
          if (bVar6) {
            return bVar6;
          }
          this_00 = (GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                     *)GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                       ::operator[]((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                     *)this,index);
          rhs_00 = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   ::operator[](rhs,index);
          bVar2 = operator==(this_00,rhs_00);
          index = index + 1;
        } while (bVar2);
      }
      break;
    case 5:
      bVar6 = StringEqual<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>(this,rhs);
      return bVar6;
    case 6:
      if (((uVar1 | *(ushort *)(this + 0xe)) >> 9 & 1) == 0) {
        bVar6 = *(long *)this == (rhs->data_).n.i64;
      }
      else {
        dVar7 = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::GetDouble((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                             *)this);
        dVar8 = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::GetDouble(rhs);
        bVar6 = (bool)(-(dVar8 == dVar7) & 1);
      }
      break;
    default:
      bVar6 = true;
    }
  }
  else {
LAB_001431b7:
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

bool operator==(const GenericValue<Encoding, SourceAllocator>& rhs) const {
        typedef GenericValue<Encoding, SourceAllocator> RhsType;
        if (GetType() != rhs.GetType())
            return false;

        switch (GetType()) {
        case kObjectType: // Warning: O(n^2) inner-loop
            if (data_.o.size != rhs.data_.o.size)
                return false;           
            for (ConstMemberIterator lhsMemberItr = MemberBegin(); lhsMemberItr != MemberEnd(); ++lhsMemberItr) {
                typename RhsType::ConstMemberIterator rhsMemberItr = rhs.FindMember(lhsMemberItr->name);
                if (rhsMemberItr == rhs.MemberEnd() || (!(lhsMemberItr->value == rhsMemberItr->value)))
                    return false;
            }
            return true;
            
        case kArrayType:
            if (data_.a.size != rhs.data_.a.size)
                return false;
            for (SizeType i = 0; i < data_.a.size; i++)
                if (!((*this)[i] == rhs[i]))
                    return false;
            return true;

        case kStringType:
            return StringEqual(rhs);

        case kNumberType:
            if (IsDouble() || rhs.IsDouble()) {
                double a = GetDouble();     // May convert from integer to double.
                double b = rhs.GetDouble(); // Ditto
                return a >= b && a <= b;    // Prevent -Wfloat-equal
            }
            else
                return data_.n.u64 == rhs.data_.n.u64;

        default:
            return true;
        }
    }